

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

bool __thiscall Arc::operator<(Arc *this,Arc *o)

{
  bool bVar1;
  
  bVar1 = true;
  if (o->u <= this->u) {
    if (this->u != o->u) {
      return false;
    }
    if (o->v <= this->v) {
      if (this->v != o->v) {
        return false;
      }
      bVar1 = this->label < o->label;
    }
  }
  return bVar1;
}

Assistant:

bool Arc::operator<(const Arc &o) const {
	return (u < o.u) ||
		   (u == o.u && v < o.v) ||
		   (u == o.u && v == o.v && label < o.label);
}